

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_Routing.cpp
# Opt level: O2

void RoutingDemo_GetData(int target,float *data,int numsamples,int numchannels)

{
  int iVar1;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  RingBuffer<65536,_float> *this;
  float *pfVar11;
  float *val;
  bool bVar12;
  
  if ((uint)target < 0x10) {
    iVar6 = *(int *)(Routing::bufferchannels + (ulong)(uint)target * 4);
    uVar7 = numchannels - iVar6;
    if (numchannels < iVar6) {
      iVar6 = numchannels;
    }
    uVar10 = 0;
    uVar9 = (ulong)-uVar7;
    if (-1 < (int)uVar7) {
      uVar9 = uVar10;
    }
    this = (RingBuffer<65536,_float> *)(&Routing::buffer + (ulong)(uint)target * 0x10002);
    uVar2 = 0;
    if (0 < numchannels) {
      uVar2 = (ulong)(uint)numchannels;
    }
    uVar8 = (ulong)uVar7;
    if ((int)uVar7 < 1) {
      uVar8 = uVar10;
    }
    pfVar11 = data;
    uVar5 = (ulong)(uint)numsamples;
    if (numsamples < 1) {
      uVar5 = uVar10;
    }
    for (; uVar4 = uVar2, val = pfVar11, uVar10 != uVar5; uVar10 = uVar10 + 1) {
      while (uVar4 != 0) {
        RingBuffer<65536,_float>::Read(this,val);
        uVar4 = uVar4 - 1;
        val = val + 1;
      }
      iVar3 = this->readpos + (int)uVar9;
      iVar1 = this->readpos + -0x10000 + (int)uVar9;
      if (iVar3 < 0x10000) {
        iVar1 = iVar3;
      }
      this->readpos = iVar1;
      uVar4 = uVar8;
      iVar1 = iVar6;
      while (bVar12 = uVar4 != 0, uVar4 = uVar4 - 1, bVar12) {
        data[iVar1] = 0.0;
        iVar1 = iVar1 + 1;
      }
      iVar6 = iVar6 + numchannels;
      pfVar11 = pfVar11 + numchannels;
    }
  }
  return;
}

Assistant:

UNITY_AUDIODSP_EXPORT_API void RoutingDemo_GetData(int target, float* data, int numsamples, int numchannels)
{
    if (target < 0 || target >= Routing::MAXINDEX)
        return;
    int skipchannels = Routing::bufferchannels[target] - numchannels; if (skipchannels < 0)
        skipchannels = 0;
    int zerochannels = numchannels - Routing::bufferchannels[target]; if (zerochannels < 0)
        zerochannels = 0;
    for (int n = 0; n < numsamples; n++)
    {
        for (int i = 0; i < numchannels; i++)
            Routing::buffer[target].Read(data[n * numchannels + i]);
        Routing::buffer[target].Skip(skipchannels);
        for (int i = 0; i < zerochannels; i++)
            data[n * numchannels + i + numchannels - zerochannels] = 0.0f;
    }
}